

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

Fraig_Node_t * Fraig_HashTableLookupF0(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  Fraig_HashTable_t *p_00;
  int iVar1;
  uint local_34;
  Fraig_Node_t *pFStack_30;
  uint Key;
  Fraig_Node_t *pEnt;
  Fraig_HashTable_t *p;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *pMan_local;
  
  p_00 = pMan->pTableF0;
  local_34 = pNode->uHashD % (uint)p_00->nBins;
  pFStack_30 = p_00->pBins[local_34];
  while( true ) {
    if (pFStack_30 == (Fraig_Node_t *)0x0) {
      if (SBORROW4(p_00->nEntries,p_00->nBins * 2) == p_00->nEntries + p_00->nBins * -2 < 0) {
        Fraig_TableResizeF(p_00,0);
        local_34 = pNode->uHashD % (uint)p_00->nBins;
      }
      pNode->pNextF = p_00->pBins[local_34];
      p_00->pBins[local_34] = pNode;
      p_00->nEntries = p_00->nEntries + 1;
      return (Fraig_Node_t *)0x0;
    }
    iVar1 = Fraig_CompareSimInfo(pNode,pFStack_30,pMan->iWordStart,0);
    if (iVar1 != 0) break;
    pFStack_30 = pFStack_30->pNextF;
  }
  return pFStack_30;
}

Assistant:

Fraig_Node_t * Fraig_HashTableLookupF0( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    Fraig_HashTable_t * p = pMan->pTableF0;
    Fraig_Node_t * pEnt;
    unsigned Key;

    // go through the hash table entries
    Key = pNode->uHashD % p->nBins;
    Fraig_TableBinForEachEntryF( p->pBins[Key], pEnt )
    {
        // if their simulation info differs, skip
        if ( !Fraig_CompareSimInfo( pNode, pEnt, pMan->iWordStart, 0 ) )
            continue;
        // found a simulation-equivalent node
        return pEnt; 
    }

    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeF( p, 0 );
        Key = pNode->uHashD % p->nBins;
    }

    // add the node to the corresponding linked list in the table
    pNode->pNextF = p->pBins[Key];
    p->pBins[Key] = pNode;
    p->nEntries++;
    // return NULL, because there is no functional equivalence in this case
    return NULL;
}